

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O1

lws_cache_ttl_lru * lws_cache_create(lws_cache_creation_info *info)

{
  _func_lws_cache_ttl_lru_ptr_lws_cache_creation_info_ptr *UNRECOVERED_JUMPTABLE;
  lws_cache_ttl_lru *plVar1;
  
  if (info == (lws_cache_creation_info *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                  ,0x117,
                  "struct lws_cache_ttl_lru *lws_cache_create(const struct lws_cache_creation_info *)"
                 );
  }
  if (info->ops == (lws_cache_ops *)0x0) {
    __assert_fail("info->ops",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                  ,0x118,
                  "struct lws_cache_ttl_lru *lws_cache_create(const struct lws_cache_creation_info *)"
                 );
  }
  if (info->name == (char *)0x0) {
    __assert_fail("info->name",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                  ,0x119,
                  "struct lws_cache_ttl_lru *lws_cache_create(const struct lws_cache_creation_info *)"
                 );
  }
  UNRECOVERED_JUMPTABLE = info->ops->create;
  if (UNRECOVERED_JUMPTABLE != (_func_lws_cache_ttl_lru_ptr_lws_cache_creation_info_ptr *)0x0) {
    plVar1 = (*UNRECOVERED_JUMPTABLE)(info);
    return plVar1;
  }
  __assert_fail("info->ops->create",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                ,0x11a,
                "struct lws_cache_ttl_lru *lws_cache_create(const struct lws_cache_creation_info *)"
               );
}

Assistant:

struct lws_cache_ttl_lru *
lws_cache_create(const struct lws_cache_creation_info *info)
{
	assert(info);
	assert(info->ops);
	assert(info->name);
	assert(info->ops->create);

	return info->ops->create(info);
}